

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
          (PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this,Index rows,Index cols)

{
  long in_RDX;
  long in_RSI;
  DenseStorage<int,__1,__1,_1,_0> *in_RDI;
  bool error;
  long max_index;
  Index in_stack_ffffffffffffffa8;
  long in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 uVar1;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    uVar1 = false;
    in_RSI = in_stack_ffffffffffffffb0;
  }
  else {
    uVar1 = 0x7fffffffffffffff / in_RDX < in_RSI;
  }
  if ((bool)uVar1 != false) {
    internal::throw_std_bad_alloc();
  }
  DenseStorage<int,_-1,_-1,_1,_0>::resize
            (in_RDI,CONCAT17(uVar1,in_stack_ffffffffffffffb8),in_RSI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void resize(Index rows, Index cols)
    {
      eigen_assert(   EIGEN_IMPLIES(RowsAtCompileTime!=Dynamic,rows==RowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime!=Dynamic,cols==ColsAtCompileTime)
                   && EIGEN_IMPLIES(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic,rows<=MaxRowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic,cols<=MaxColsAtCompileTime)
                   && rows>=0 && cols>=0 && "Invalid sizes when resizing a matrix or array.");
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(rows, cols);
      #ifdef EIGEN_INITIALIZE_COEFFS
        Index size = rows*cols;
        bool size_changed = size != this->size();
        m_storage.resize(size, rows, cols);
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #else
        m_storage.resize(rows*cols, rows, cols);
      #endif
    }